

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_objectwriter.h
# Opt level: O2

void __thiscall google::protobuf::util::converter::JsonObjectWriter::NewLine(JsonObjectWriter *this)

{
  size_type sVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  uint8 *puVar4;
  undefined4 extraout_var_00;
  int i;
  size_t __n;
  
  sVar1 = (this->indent_string_)._M_string_length;
  if (sVar1 != 0) {
    iVar2 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x11])();
    if (0 < this->indent_count_) {
      __n = sVar1 * (long)*(int *)(CONCAT44(extraout_var,iVar2) + 0x10);
      puVar4 = io::CodedOutputStream::GetDirectBufferForNBytesAndAdvance(this->stream_,(int)__n + 1)
      ;
      if (puVar4 != (uint8 *)0x0) {
        *puVar4 = '\n';
        memset(puVar4 + 1,*(int *)&this->indent_char_,__n);
        return;
      }
    }
    WriteChar(this,'\n');
    iVar2 = 0;
    while( true ) {
      iVar3 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x11])
                        (this);
      if (*(int *)(CONCAT44(extraout_var_00,iVar3) + 0x10) <= iVar2) break;
      io::CodedOutputStream::WriteRaw
                (this->stream_,(this->indent_string_)._M_dataplus._M_p,
                 (int)(this->indent_string_)._M_string_length);
      iVar2 = iVar2 + 1;
    }
  }
  return;
}

Assistant:

void NewLine() {
    if (!indent_string_.empty()) {
      size_t len = sizeof('\n') + (indent_string_.size() * element()->level());

      // Take the slow-path if we don't have sufficient characters remaining in
      // our buffer or we have a non-trivial indent string which would prevent
      // us from using memset.
      uint8* out = nullptr;
      if (indent_count_ > 0) {
        out = stream_->GetDirectBufferForNBytesAndAdvance(len);
      }

      if (out != nullptr) {
        out[0] = '\n';
        memset(&out[1], indent_char_, len - 1);
      } else {
        // Slow path, no contiguous output buffer available.
        WriteChar('\n');
        for (int i = 0; i < element()->level(); i++) {
          stream_->WriteRaw(indent_string_.c_str(), indent_string_.length());
        }
      }
    }
  }